

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_kmgmt.c
# Opt level: O0

int ec_get_ecm_params(EC_GROUP *group,OSSL_PARAM *params)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  EC_GROUP *in_RDI;
  int fid;
  char *basis_name;
  int basis_nid;
  uint k3;
  uint k2;
  uint k1;
  int m;
  int ret;
  EC_GROUP *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  EC_GROUP *group_00;
  int local_1c;
  
  local_1c = 0;
  iVar2 = EC_GROUP_get_field_type(in_RDI);
  if (iVar2 != 0x197) {
    return 1;
  }
  iVar3 = EC_GROUP_get_basis_type((EC_GROUP *)in_RDI);
  if (iVar3 == 0x2aa) {
    pcVar1 = "p.tpBasis";
  }
  else {
    if (iVar3 != 0x2ab) {
      return 0;
    }
    pcVar1 = "p.ppBasis";
  }
  group_00 = (EC_GROUP *)(pcVar1 + 2);
  EC_GROUP_get_degree((EC_GROUP *)in_RDI);
  iVar4 = ossl_param_build_set_int
                    ((OSSL_PARAM_BLD *)group_00,
                     (OSSL_PARAM *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                     (char *)in_stack_ffffffffffffffb8,0);
  if ((iVar4 != 0) &&
     (iVar4 = ossl_param_build_set_utf8_string
                        ((OSSL_PARAM_BLD *)group_00,
                         (OSSL_PARAM *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                         (char *)in_stack_ffffffffffffffb8,(char *)0x335827), iVar4 != 0)) {
    if (iVar3 == 0x2aa) {
      iVar3 = EC_GROUP_get_trinomial_basis(in_stack_ffffffffffffffb8,(uint *)0x33584a);
      if (iVar3 == 0) {
        return 0;
      }
      iVar2 = ossl_param_build_set_int
                        ((OSSL_PARAM_BLD *)group_00,
                         (OSSL_PARAM *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                         (char *)in_stack_ffffffffffffffb8,0);
    }
    else {
      iVar3 = EC_GROUP_get_pentanomial_basis
                        (group_00,(uint *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                         (uint *)in_stack_ffffffffffffffb8,(uint *)0x33588d);
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = ossl_param_build_set_int
                        ((OSSL_PARAM_BLD *)group_00,
                         (OSSL_PARAM *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                         (char *)in_stack_ffffffffffffffb8,0);
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = ossl_param_build_set_int
                        ((OSSL_PARAM_BLD *)group_00,
                         (OSSL_PARAM *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                         (char *)in_stack_ffffffffffffffb8,0);
      if (iVar3 == 0) {
        return 0;
      }
      iVar2 = ossl_param_build_set_int
                        ((OSSL_PARAM_BLD *)group_00,
                         (OSSL_PARAM *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                         (char *)in_stack_ffffffffffffffb8,0);
    }
    if (iVar2 != 0) {
      local_1c = 1;
    }
  }
  return local_1c;
}

Assistant:

static int ec_get_ecm_params(const EC_GROUP *group, OSSL_PARAM params[])
{
#ifdef OPENSSL_NO_EC2M
    return 1;
#else
    int ret = 0, m;
    unsigned int k1 = 0, k2 = 0, k3 = 0;
    int basis_nid;
    const char *basis_name = NULL;
    int fid = EC_GROUP_get_field_type(group);

    if (fid != NID_X9_62_characteristic_two_field)
        return 1;

    basis_nid = EC_GROUP_get_basis_type(group);
    if (basis_nid == NID_X9_62_tpBasis)
        basis_name = SN_X9_62_tpBasis;
    else if (basis_nid == NID_X9_62_ppBasis)
        basis_name = SN_X9_62_ppBasis;
    else
        goto err;

    m = EC_GROUP_get_degree(group);
    if (!ossl_param_build_set_int(NULL, params, OSSL_PKEY_PARAM_EC_CHAR2_M, m)
        || !ossl_param_build_set_utf8_string(NULL, params,
                                             OSSL_PKEY_PARAM_EC_CHAR2_TYPE,
                                             basis_name))
        goto err;

    if (basis_nid == NID_X9_62_tpBasis) {
        if (!EC_GROUP_get_trinomial_basis(group, &k1)
            || !ossl_param_build_set_int(NULL, params,
                                         OSSL_PKEY_PARAM_EC_CHAR2_TP_BASIS,
                                         (int)k1))
            goto err;
    } else {
        if (!EC_GROUP_get_pentanomial_basis(group, &k1, &k2, &k3)
            || !ossl_param_build_set_int(NULL, params,
                                         OSSL_PKEY_PARAM_EC_CHAR2_PP_K1, (int)k1)
            || !ossl_param_build_set_int(NULL, params,
                                         OSSL_PKEY_PARAM_EC_CHAR2_PP_K2, (int)k2)
            || !ossl_param_build_set_int(NULL, params,
                                         OSSL_PKEY_PARAM_EC_CHAR2_PP_K3, (int)k3))
            goto err;
    }
    ret = 1;
err:
    return ret;
#endif /* OPENSSL_NO_EC2M */
}